

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SpawnProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  AActor *pAVar2;
  double dVar3;
  double x;
  double y;
  BYTE BVar4;
  int iVar5;
  undefined4 extraout_var;
  AActor *pAVar7;
  PClass *pPVar8;
  AActor *pAVar9;
  undefined4 extraout_var_01;
  long lVar10;
  PClassActor *pPVar11;
  PClassActor *type;
  AActor *origin;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  DVector2 v;
  double local_e0;
  double local_d8;
  void *local_c0;
  double local_b8;
  double local_90;
  double local_88;
  double dStack_80;
  DAngle local_70;
  DVector3 local_68;
  DVector3 local_48;
  PClass *pPVar6;
  undefined4 extraout_var_00;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_003cbd0b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003cbcf2:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cbd0b:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b7,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003cb596;
    pPVar6 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
      (origin->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar15 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar8 && bVar15) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar15 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar8) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar15) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003cbd0b;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003cbcf2;
LAB_003cb596:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_003cbd2a;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003cbcfb:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cbd2a:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b8,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003cb5f6;
    pPVar11 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar11 = (PClassActor *)(pPVar11->super_PClass).ParentClass;
        if (pPVar11 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar11 != (PClassActor *)0x0);
      if (pPVar11 == (PClassActor *)0x0) {
        pcVar13 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003cbd2a;
      }
    }
    bVar15 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003cbcfb;
LAB_003cb5f6:
    bVar15 = true;
    type = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003cbdd7;
    }
    uVar16 = (undefined4)*(undefined8 *)&param[2].field_0;
    uVar17 = (undefined4)((ulong)*(undefined8 *)&param[2].field_0 >> 0x20);
LAB_003cb63a:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cbdf6:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5ba,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_c0 = param[3].field_0.field_1.a;
LAB_003cb64b:
    local_d8 = (double)CONCAT44(uVar17,uVar16);
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cbda6:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bb,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar16 = (undefined4)*(undefined8 *)&param[4].field_0;
    uVar17 = (undefined4)((ulong)*(undefined8 *)&param[4].field_0 >> 0x20);
LAB_003cb662:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cbd87:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bc,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar14 = param[5].field_0.i;
LAB_003cb671:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cbd68:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bd,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_e0 = param[6].field_0.f;
LAB_003cb682:
    local_b8 = (double)CONCAT44(uVar17,uVar16);
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cbd49:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5be,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cbdd7:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5b9,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_d8 = param[2].field_0.f;
    uVar16 = SUB84(local_d8,0);
    uVar17 = (undefined4)((ulong)local_d8 >> 0x20);
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003cb63a;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003cbdf6;
    }
    local_c0 = (void *)param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003cb64b;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003cbda6;
    }
    local_b8 = param[4].field_0.f;
    uVar16 = SUB84(local_b8,0);
    uVar17 = (undefined4)((ulong)local_b8 >> 0x20);
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003cb662;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cbd87;
    }
    uVar14 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003cb671;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003cbd68;
    }
    local_e0 = param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003cb682;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cbd49;
    }
  }
  pAVar7 = COPY_AAPTR(origin,param[7].field_0.i);
  uVar12 = uVar14 & 3;
  if ((pAVar7 == (AActor *)0x0) && (uVar12 != 2)) {
    if ((uVar14 & 8) == 0) {
      return 0;
    }
    if (origin->SeeState == (FState *)0x0) {
      return 0;
    }
    if ((origin->health < 1) && (((origin->flags3).Value & 0x2000) != 0)) {
      return 0;
    }
    AActor::SetState(origin,origin->SeeState,false);
    return 0;
  }
  if (bVar15) {
    return 0;
  }
  dVar19 = FFastTrig::cos(&fasttrig,
                          ((origin->Angles).Yaw.Degrees + -90.0) * 11930464.711111112 +
                          6755399441055744.0);
  dVar18 = FFastTrig::sin(&fasttrig,dVar19);
  local_90 = 0.0;
  dVar3 = AActor::GetBobOffset(origin,0.0);
  if (origin->player != (player_t *)0x0) {
    local_90 = origin->player->crouchoffset;
  }
  dVar19 = dVar19 * (double)local_c0;
  dVar18 = dVar18 * (double)local_c0;
  if (uVar12 == 1) {
    dVar3 = AActor::GetBobOffset(origin,0.0);
    P_GetOffsetPosition((origin->__Pos).X,(origin->__Pos).Y,dVar19,dVar18);
    local_68.Z = local_d8 + dVar3 + (origin->__Pos).Z;
    pAVar7 = P_SpawnMissileXYZ(&local_68,origin,pAVar7,type,false,(AActor *)0x0);
  }
  else {
    x = (origin->__Pos).X;
    y = (origin->__Pos).Y;
    dVar1 = (origin->__Pos).Z;
    if (uVar12 == 2) {
      P_GetOffsetPosition(x,y,dVar19,dVar18);
      dVar18 = (origin->__Pos).Z + 0.0;
      (origin->__Pos).Z = dVar18;
      (origin->__Pos).X = local_88;
      (origin->__Pos).Y = dStack_80;
      dVar19 = AActor::GetBobOffset(origin,0.0);
      local_70.Degrees = (origin->Angles).Yaw.Degrees;
      pAVar7 = P_SpawnMissileAngleZSpeed
                         (origin,dVar19 + dVar18 + local_d8,type,&local_70,0.0,
                          *(double *)((type->super_PClass).Defaults + 0xe0),origin,false);
      (origin->__Pos).Z = dVar1;
      (origin->__Pos).X = x;
      (origin->__Pos).Y = y;
      uVar14 = uVar14 | 0x10;
    }
    else {
      P_GetOffsetPosition(x,y,dVar19,dVar18);
      local_48.Z = local_d8 + dVar3 + -32.0 + local_90 + (origin->__Pos).Z;
      (origin->__Pos).Z = local_48.Z;
      local_48.Z = local_48.Z + 32.0;
      (origin->__Pos).X = local_88;
      (origin->__Pos).Y = dStack_80;
      pAVar7 = P_SpawnMissileXYZ(&local_48,origin,pAVar7,type,false,(AActor *)0x0);
      (origin->__Pos).Z = dVar1;
      (origin->__Pos).X = x;
      (origin->__Pos).Y = y;
    }
  }
  if (pAVar7 == (AActor *)0x0) {
    return 0;
  }
  if ((uVar14 & 0x30) == 0) {
    dVar19 = (pAVar7->Vel).X;
    dVar18 = (pAVar7->Vel).Y;
    dVar19 = c_sqrt(dVar18 * dVar18 + dVar19 * dVar19);
  }
  else {
    if ((uVar14 & 0x20) != 0) {
      dVar19 = (pAVar7->Vel).X;
      dVar18 = (pAVar7->Vel).Y;
      dVar19 = c_sqrt(dVar18 * dVar18 + dVar19 * dVar19);
      dVar19 = c_atan2((pAVar7->Vel).Z,dVar19);
      local_e0 = local_e0 + dVar19 * 57.29577951308232;
    }
    dVar19 = FFastTrig::cos(&fasttrig,local_e0 * 11930464.711111112 + 6755399441055744.0);
    dVar19 = ABS(dVar19 * pAVar7->Speed);
    dVar18 = FFastTrig::sin(&fasttrig,dVar19);
    dVar18 = dVar18 * pAVar7->Speed;
    (pAVar7->Vel).Z = dVar18;
    if ((uVar14 >> 8 & 1) == 0) {
      (pAVar7->Vel).Z = -dVar18;
    }
  }
  if ((uVar14 & 0x40) != 0) {
    (pAVar7->Angles).Pitch.Degrees = local_e0;
  }
  if (-1 < (char)uVar14) {
    local_b8 = local_b8 + (pAVar7->Angles).Yaw.Degrees;
  }
  (pAVar7->Angles).Yaw.Degrees = local_b8;
  AActor::VelFromAngle(pAVar7,dVar19);
  uVar12 = (origin->flags).Value;
  pAVar2 = origin;
  if (((uVar14 & 4) == 0) || ((uVar12 & 0x10000) != 0)) {
    if ((uVar12 >> 0x10 & 1) == 0) goto LAB_003cbc7a;
LAB_003cbbab:
    do {
      pAVar9 = pAVar2;
      uVar12 = (pAVar9->flags).Value;
      if (((uVar14 & 4) == 0) || ((uVar12 & 0x10000) != 0)) {
        if ((uVar12 >> 0x10 & 1) == 0) goto LAB_003cbc0e;
      }
      else {
        pPVar8 = (pAVar9->super_DThinker).super_DObject.Class;
        if (pPVar8 == (PClass *)0x0) {
          iVar5 = (**(pAVar9->super_DThinker).super_DObject._vptr_DObject)(pAVar9);
          pPVar8 = (PClass *)CONCAT44(extraout_var_01,iVar5);
          (pAVar9->super_DThinker).super_DObject.Class = pPVar8;
        }
        if ((pPVar8->Defaults[0x1be] & 1) == 0) goto LAB_003cbc0e;
      }
      pAVar2 = (pAVar9->target).field_0.p;
      if (pAVar2 == (AActor *)0x0) goto LAB_003cbc0e;
    } while (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0);
    (pAVar9->target).field_0.p = (AActor *)0x0;
LAB_003cbc0e:
    (pAVar7->target).field_0.p = pAVar9;
    lVar10 = 0x278;
    if ((((pAVar7->flags2).Value & (origin->flags2).Value) >> 0x1e & 1) != 0) {
LAB_003cbc2d:
      (pAVar7->tracer).field_0 =
           *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
            ((long)&(origin->super_DThinker).super_DObject._vptr_DObject + lVar10);
    }
  }
  else {
    pPVar8 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar5 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar8 = (PClass *)CONCAT44(extraout_var_00,iVar5);
      (origin->super_DThinker).super_DObject.Class = pPVar8;
    }
    if ((pPVar8->Defaults[0x1be] & 1) != 0) goto LAB_003cbbab;
LAB_003cbc7a:
    lVar10 = 0x208;
    if (((pAVar7->flags2).Value & 0x40000000) != 0) goto LAB_003cbc2d;
  }
  if (((pAVar7->flags4).Value & 0x40000) == 0) goto LAB_003cbca8;
  pAVar2 = (pAVar7->target).field_0.p;
  if (pAVar2 == (AActor *)0x0) {
LAB_003cbc9f:
    BVar4 = '\0';
  }
  else {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (pAVar7->target).field_0.p = (AActor *)0x0;
      goto LAB_003cbc9f;
    }
    if (pAVar2->player == (player_t *)0x0) goto LAB_003cbc9f;
    BVar4 = (char)((int)pAVar2->player + 0xfe81e1c0U >> 5) * '=' + '\x01';
  }
  pAVar7->FriendPlayer = BVar4;
LAB_003cbca8:
  P_CheckMissileSpawn(pAVar7,origin->radius);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnProjectile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT_DEF	(Spawnheight);
	PARAM_FLOAT_DEF	(Spawnofs_xy);
	PARAM_ANGLE_DEF	(Angle);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(Pitch);
	PARAM_INT_DEF	(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	int aimmode = flags & CMF_AIMMODE;

	AActor * targ;
	AActor * missile;

	if (ref != NULL || aimmode == 2)
	{
		if (ti) 
		{
			DAngle angle = self->Angles.Yaw - 90;
			double x = Spawnofs_xy * angle.Cos();
			double y = Spawnofs_xy * angle.Sin();
			double z = Spawnheight + self->GetBobOffset() - 32 + (self->player? self->player->crouchoffset : 0.);

			DVector3 pos = self->Pos();
			switch (aimmode)
			{
			case 0:
			default:
				// same adjustment as above (in all 3 directions this time) - for better aiming!
				self->SetXYZ(self->Vec3Offset(x, y, z));
				missile = P_SpawnMissileXYZ(self->PosPlusZ(32.), self, ref, ti, false);
				self->SetXYZ(pos);
				break;

			case 1:
				missile = P_SpawnMissileXYZ(self->Vec3Offset(x, y, self->GetBobOffset() + Spawnheight), self, ref, ti, false);
				break;

			case 2:
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				missile = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, ti, self->Angles.Yaw, 0, GetDefaultByType(ti)->Speed, self, false);
				self->SetXYZ(pos);

				flags |= CMF_ABSOLUTEPITCH;

				break;
			}

			if (missile != NULL)
			{
				// Use the actual velocity instead of the missile's Speed property
				// so that this can handle missiles with a high vertical velocity 
				// component properly.

				double missilespeed;

				if ( (CMF_ABSOLUTEPITCH|CMF_OFFSETPITCH) & flags)
				{
					if (CMF_OFFSETPITCH & flags)
					{
						Pitch += missile->Vel.Pitch();
					}
					missilespeed = fabs(Pitch.Cos() * missile->Speed);
					missile->Vel.Z = Pitch.Sin() * missile->Speed;
					if (!(flags & CMF_BADPITCH)) missile->Vel.Z *= -1;
				}
				else
				{
					missilespeed = missile->VelXYToSpeed();
				}

				if (CMF_SAVEPITCH & flags)
				{
					missile->Angles.Pitch = Pitch;
					// In aimmode 0 and 1 without absolutepitch or offsetpitch, the pitch parameter
					// contains the unapplied parameter. In that case, it is set as pitch without
					// otherwise affecting the spawned actor.
				}

				missile->Angles.Yaw = (CMF_ABSOLUTEANGLE & flags) ? Angle : missile->Angles.Yaw + Angle;
				missile->VelFromAngle(missilespeed);
	
				// handle projectile shooting projectiles - track the
				// links back to a real owner
                if (self->isMissile(!!(flags & CMF_TRACKOWNER)))
                {
                	AActor *owner = self ;//->target;
                	while (owner->isMissile(!!(flags & CMF_TRACKOWNER)) && owner->target)
						owner = owner->target;
                	targ = owner;
                	missile->target = owner;
					// automatic handling of seeker missiles
					if (self->flags2 & missile->flags2 & MF2_SEEKERMISSILE)
					{
						missile->tracer = self->tracer;
					}
                }
				else if (missile->flags2 & MF2_SEEKERMISSILE)
				{
					// automatic handling of seeker missiles
					missile->tracer = self->target;
				}
				// we must redo the spectral check here because the owner is set after spawning so the FriendPlayer value may be wrong
				if (missile->flags4 & MF4_SPECTRAL)
				{
					if (missile->target != NULL)
					{
						missile->SetFriendPlayer(missile->target->player);
					}
					else
					{
						missile->FriendPlayer = 0;
					}
				}
				P_CheckMissileSpawn(missile, self->radius);
			}
		}
	}
	else if (flags & CMF_CHECKTARGETDEAD)
	{
		// Target is dead and the attack shall be aborted.
		if (self->SeeState != NULL && (self->health > 0 || !(self->flags3 & MF3_ISMONSTER)))
			self->SetState(self->SeeState);
	}
	return 0;
}